

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void * __thiscall
kj::anon_unknown_59::InMemoryFile::mmap
          (InMemoryFile *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  bool bVar1;
  Impl *pIVar2;
  MmapDisposer *this_00;
  uchar *puVar3;
  undefined4 in_register_0000000c;
  undefined1 local_a8 [24];
  ArrayDisposer *disposer;
  undefined1 local_88 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_68;
  Fault f;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  uint64_t size_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  _kjCondition._32_8_ = CONCAT44(in_register_0000000c,__prot);
  f.exception = (Exception *)(__len + _kjCondition._32_8_);
  size_local = __len;
  offset_local = (uint64_t)__addr;
  this_local = this;
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&f);
  kj::_::DebugExpression<unsigned_long>::operator>=
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_50,&local_58,&size_local);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[32]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x32c,FAILED,"offset + size >= offset",
               "_kjCondition,\"mmap() request overflows uint64\"",
               (DebugComparison<unsigned_long,_unsigned_long_&> *)local_50,
               (char (*) [32])"mmap() request overflows uint64");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88,
             (long)__addr + 0x18);
  pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
  Impl::ensureCapacity(pIVar2,size_local + _kjCondition._32_8_);
  this_00 = (MmapDisposer *)operator_new(0x18);
  atomicAddRef<kj::(anonymous_namespace)::InMemoryFile>((kj *)local_a8,(InMemoryFile *)__addr);
  MmapDisposer::MmapDisposer
            (this_00,(Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)local_a8)
  ;
  Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own
            ((Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)local_a8);
  local_a8._16_8_ = this_00;
  pIVar2 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
  puVar3 = Array<unsigned_char>::begin(&pIVar2->bytes);
  Array<const_unsigned_char>::Array
            ((Array<const_unsigned_char> *)this,puVar3 + size_local,_kjCondition._32_8_,
             (ArrayDisposer *)local_a8._16_8_);
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_88);
  return this;
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const override {
    KJ_REQUIRE(offset + size >= offset, "mmap() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(offset + size);

    ArrayDisposer* disposer = new MmapDisposer(atomicAddRef(*this));
    return Array<const byte>(lock->bytes.begin() + offset, size, *disposer);
  }